

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O3

void ImPlot::PopStyleVar(int count)

{
  long lVar1;
  ImGuiStyleMod *pIVar2;
  ImPlotContext *pIVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  
  pIVar3 = GImPlot;
  uVar4 = (GImPlot->StyleModifiers).Size;
  if ((int)uVar4 < count) {
    __assert_fail("(count <= gp.StyleModifiers.Size) && \"You can\'t pop more modifiers than have been pushed!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xcdd,"void ImPlot::PopStyleVar(int)");
  }
  if (0 < count) {
    iVar5 = count + 1;
    do {
      if ((int)uVar4 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                      ,0x695,"T &ImVector<ImGuiStyleMod>::back() [T = ImGuiStyleMod]");
      }
      pIVar2 = (pIVar3->StyleModifiers).Data;
      if (0x1a < (ulong)(uint)pIVar2[(ulong)uVar4 - 1].VarIdx) {
        __assert_fail("idx >= 0 && idx < ImPlotStyleVar_COUNT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                      ,0x122,"const ImPlotStyleVarInfo *ImPlot::GetPlotStyleVarInfo(ImPlotStyleVar)"
                     );
      }
      lVar1 = (ulong)(uint)pIVar2[(ulong)uVar4 - 1].VarIdx * 0xc;
      uVar6 = (ulong)*(uint *)(GPlotStyleVarInfo + lVar1 + 8);
      if (*(int *)(GPlotStyleVarInfo + lVar1) == 4) {
        if (*(int *)(GPlotStyleVarInfo + lVar1 + 4) == 1) {
          *(int *)(pIVar3->RenderY + uVar6 + 6) = pIVar2[(ulong)uVar4 - 1].field_1.BackupInt[0];
          uVar4 = (pIVar3->StyleModifiers).Size;
          if ((int)uVar4 < 1) {
            __assert_fail("Size > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                          ,0x6a1,"void ImVector<ImGuiStyleMod>::pop_back() [T = ImGuiStyleMod]");
          }
        }
      }
      else if (*(int *)(GPlotStyleVarInfo + lVar1) == 8) {
        if (*(int *)(GPlotStyleVarInfo + lVar1 + 4) == 2) {
          *(int *)(pIVar3->RenderY + uVar6 + 6) = pIVar2[(ulong)uVar4 - 1].field_1.BackupInt[0];
          *(int *)(pIVar3->RenderY + uVar6 + 10) = pIVar2[(ulong)uVar4 - 1].field_1.BackupInt[1];
        }
        else if (*(int *)(GPlotStyleVarInfo + lVar1 + 4) == 1) {
          *(int *)(pIVar3->RenderY + uVar6 + 6) = pIVar2[(ulong)uVar4 - 1].field_1.BackupInt[0];
        }
      }
      uVar4 = uVar4 - 1;
      (pIVar3->StyleModifiers).Size = uVar4;
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  return;
}

Assistant:

void PopStyleVar(int count) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(count <= gp.StyleModifiers.Size, "You can't pop more modifiers than have been pushed!");
    while (count > 0) {
        ImGuiStyleMod& backup = gp.StyleModifiers.back();
        const ImPlotStyleVarInfo* info = GetPlotStyleVarInfo(backup.VarIdx);
        void* data = info->GetVarPtr(&gp.Style);
        if (info->Type == ImGuiDataType_Float && info->Count == 1) {
            ((float*)data)[0] = backup.BackupFloat[0];
        }
        else if (info->Type == ImGuiDataType_Float && info->Count == 2) {
             ((float*)data)[0] = backup.BackupFloat[0];
             ((float*)data)[1] = backup.BackupFloat[1];
        }
        else if (info->Type == ImGuiDataType_S32 && info->Count == 1) {
            ((int*)data)[0] = backup.BackupInt[0];
        }
        gp.StyleModifiers.pop_back();
        count--;
    }
}